

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::PrintInitExpr(BinaryReaderObjdump *this,InitExpr *expr)

{
  char *pcVar1;
  string_view sVar2;
  char buffer [40];
  
  switch(expr->type) {
  case I32:
    PrintDetails(this," - init i32=%d\n",(ulong)(expr->value).index);
    return;
  case F32:
    WriteFloatHex(buffer,0x14,(expr->value).i32);
    pcVar1 = " - init f32=%s\n";
    break;
  case I64:
    PrintDetails(this," - init i64=%ld\n",(expr->value).i64);
    return;
  case F64:
    WriteDoubleHex(buffer,0x28,(expr->value).i64);
    pcVar1 = " - init f64=%s\n";
    break;
  case V128:
    PrintDetails(this," - init v128=0x%08x 0x%08x 0x%08x 0x%08x \n",(ulong)(expr->value).index,
                 (ulong)*(uint *)((long)&expr->value + 4),(ulong)*(uint *)((long)&expr->value + 8),
                 (ulong)*(uint *)((long)&expr->value + 0xc));
    return;
  case Global:
    PrintDetails(this," - init global=%u",(ulong)(expr->value).index);
    sVar2 = BinaryReaderObjdumpBase::GetGlobalName
                      (&this->super_BinaryReaderObjdumpBase,(expr->value).index);
    goto LAB_0012bc6e;
  case FuncRef:
    PrintDetails(this," - init ref.func:%u",(ulong)(expr->value).index);
    sVar2 = BinaryReaderObjdumpBase::GetFunctionName
                      (&this->super_BinaryReaderObjdumpBase,(expr->value).index);
LAB_0012bc6e:
    if (sVar2.size_ != 0) {
      PrintDetails(this," <%.*s>",sVar2.size_,sVar2.data_);
    }
    pcVar1 = "\n";
LAB_0012bc8e:
    PrintDetails(this,pcVar1);
    return;
  case NullRef:
    pcVar1 = " - init null\n";
    goto LAB_0012bc8e;
  default:
    goto switchD_0012bb73_default;
  }
  PrintDetails(this,pcVar1,buffer);
switchD_0012bb73_default:
  return;
}

Assistant:

void BinaryReaderObjdump::PrintInitExpr(const InitExpr& expr) {
  switch (expr.type) {
    case InitExprType::I32:
      PrintDetails(" - init i32=%d\n", expr.value.i32);
      break;
    case InitExprType::I64:
      PrintDetails(" - init i64=%" PRId64 "\n", expr.value.i64);
      break;
    case InitExprType::F64: {
      char buffer[WABT_MAX_DOUBLE_HEX];
      WriteDoubleHex(buffer, sizeof(buffer), expr.value.f64);
      PrintDetails(" - init f64=%s\n", buffer);
      break;
    }
    case InitExprType::F32: {
      char buffer[WABT_MAX_FLOAT_HEX];
      WriteFloatHex(buffer, sizeof(buffer), expr.value.f32);
      PrintDetails(" - init f32=%s\n", buffer);
      break;
    }
    case InitExprType::V128: {
      PrintDetails(" - init v128=0x%08x 0x%08x 0x%08x 0x%08x \n",
                   expr.value.v128_v.u32(0), expr.value.v128_v.u32(1),
                   expr.value.v128_v.u32(2), expr.value.v128_v.u32(3));
      break;
    }
    case InitExprType::Global: {
      PrintDetails(" - init global=%" PRIindex, expr.value.index);
      string_view name = GetGlobalName(expr.value.index);
      if (!name.empty()) {
        PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
      }
      PrintDetails("\n");
      break;
    }
    case InitExprType::FuncRef: {
      PrintDetails(" - init ref.func:%" PRIindex, expr.value.index);
      string_view name = GetFunctionName(expr.value.index);
      if (!name.empty()) {
        PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
      }
      PrintDetails("\n");
      break;
    }
    case InitExprType::NullRef: {
      PrintDetails(" - init null\n");
      break;
    }
  }
}